

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MercatorTile.cpp
# Opt level: O3

vector<mercatortile::Tile,_std::allocator<mercatortile::Tile>_> *
mercatortile::children
          (vector<mercatortile::Tile,_std::allocator<mercatortile::Tile>_> *__return_storage_ptr__,
          Tile *tile,int *zoom)

{
  int iVar1;
  int iVar2;
  vector<mercatortile::Tile,std::allocator<mercatortile::Tile>> *pvVar3;
  undefined8 *puVar4;
  int iVar5;
  deque<mercatortile::Tile,_std::allocator<mercatortile::Tile>_> return_tiles;
  Tile local_e8;
  _Deque_base<mercatortile::Tile,_std::allocator<mercatortile::Tile>_> local_d8;
  vector<mercatortile::Tile,std::allocator<mercatortile::Tile>> *local_80;
  move_iterator<std::_Deque_iterator<mercatortile::Tile,_mercatortile::Tile_&,_mercatortile::Tile_*>_>
  local_78;
  move_iterator<std::_Deque_iterator<mercatortile::Tile,_mercatortile::Tile_&,_mercatortile::Tile_*>_>
  local_50;
  
  if (*zoom < tile->z) {
    puVar4 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar4 = "zoom should be greater than tile zoom level.";
    __cxa_throw(puVar4,&char_const*::typeinfo,0);
  }
  local_e8.z = tile->z;
  local_e8.x = tile->x;
  local_e8.y = tile->y;
  local_d8._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_d8._M_impl.super__Deque_impl_data._M_map_size = 0;
  local_d8._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_d8._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_d8._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_d8._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_d8._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_d8._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_d8._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_d8._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  std::deque<mercatortile::Tile,std::allocator<mercatortile::Tile>>::
  _M_range_initialize<mercatortile::Tile_const*>
            ((deque<mercatortile::Tile,std::allocator<mercatortile::Tile>> *)&local_d8,&local_e8);
  iVar5 = (local_d8._M_impl.super__Deque_impl_data._M_start._M_cur)->z;
  local_80 = (vector<mercatortile::Tile,std::allocator<mercatortile::Tile>> *)__return_storage_ptr__
  ;
  if (iVar5 < *zoom) {
    do {
      iVar1 = (local_d8._M_impl.super__Deque_impl_data._M_start._M_cur)->x;
      iVar2 = (local_d8._M_impl.super__Deque_impl_data._M_start._M_cur)->y;
      if (local_d8._M_impl.super__Deque_impl_data._M_start._M_cur ==
          local_d8._M_impl.super__Deque_impl_data._M_start._M_last + -1) {
        operator_delete(local_d8._M_impl.super__Deque_impl_data._M_start._M_first);
        local_d8._M_impl.super__Deque_impl_data._M_start._M_cur =
             local_d8._M_impl.super__Deque_impl_data._M_start._M_node[1];
        local_d8._M_impl.super__Deque_impl_data._M_start._M_last =
             local_d8._M_impl.super__Deque_impl_data._M_start._M_cur + 0x2a;
        local_d8._M_impl.super__Deque_impl_data._M_start._M_first =
             local_d8._M_impl.super__Deque_impl_data._M_start._M_cur;
        local_d8._M_impl.super__Deque_impl_data._M_start._M_node =
             local_d8._M_impl.super__Deque_impl_data._M_start._M_node + 1;
      }
      else {
        local_d8._M_impl.super__Deque_impl_data._M_start._M_cur =
             local_d8._M_impl.super__Deque_impl_data._M_start._M_cur + 1;
      }
      iVar1 = iVar1 * 2;
      iVar2 = iVar2 * 2;
      local_e8.y = iVar2;
      local_e8.x = iVar1;
      iVar5 = iVar5 + 1;
      if (local_d8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          local_d8._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
        local_e8.z = iVar5;
        std::deque<mercatortile::Tile,_std::allocator<mercatortile::Tile>_>::
        _M_push_back_aux<mercatortile::Tile>
                  ((deque<mercatortile::Tile,_std::allocator<mercatortile::Tile>_> *)&local_d8,
                   &local_e8);
      }
      else {
        (local_d8._M_impl.super__Deque_impl_data._M_finish._M_cur)->z = iVar5;
        (local_d8._M_impl.super__Deque_impl_data._M_finish._M_cur)->x = iVar1;
        (local_d8._M_impl.super__Deque_impl_data._M_finish._M_cur)->y = iVar2;
        local_d8._M_impl.super__Deque_impl_data._M_finish._M_cur =
             local_d8._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
      }
      local_e8._0_8_ = CONCAT44(iVar2,iVar1) | 1;
      if (local_d8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          local_d8._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
        local_e8.z = iVar5;
        std::deque<mercatortile::Tile,_std::allocator<mercatortile::Tile>_>::
        _M_push_back_aux<mercatortile::Tile>
                  ((deque<mercatortile::Tile,_std::allocator<mercatortile::Tile>_> *)&local_d8,
                   &local_e8);
      }
      else {
        (local_d8._M_impl.super__Deque_impl_data._M_finish._M_cur)->z = iVar5;
        (local_d8._M_impl.super__Deque_impl_data._M_finish._M_cur)->x = local_e8.x;
        (local_d8._M_impl.super__Deque_impl_data._M_finish._M_cur)->y = local_e8.y;
        local_d8._M_impl.super__Deque_impl_data._M_finish._M_cur =
             local_d8._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
      }
      local_e8._0_8_ = CONCAT44(iVar2,iVar1) | 0x100000000;
      if (local_d8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          local_d8._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
        local_e8.z = iVar5;
        std::deque<mercatortile::Tile,_std::allocator<mercatortile::Tile>_>::
        _M_push_back_aux<mercatortile::Tile>
                  ((deque<mercatortile::Tile,_std::allocator<mercatortile::Tile>_> *)&local_d8,
                   &local_e8);
      }
      else {
        (local_d8._M_impl.super__Deque_impl_data._M_finish._M_cur)->z = iVar5;
        (local_d8._M_impl.super__Deque_impl_data._M_finish._M_cur)->x = local_e8.x;
        (local_d8._M_impl.super__Deque_impl_data._M_finish._M_cur)->y = local_e8.y;
        local_d8._M_impl.super__Deque_impl_data._M_finish._M_cur =
             local_d8._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
      }
      local_e8._0_8_ = CONCAT44(iVar2,iVar1) | 0x100000001;
      if (local_d8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          local_d8._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
        local_e8.z = iVar5;
        std::deque<mercatortile::Tile,_std::allocator<mercatortile::Tile>_>::
        _M_push_back_aux<mercatortile::Tile>
                  ((deque<mercatortile::Tile,_std::allocator<mercatortile::Tile>_> *)&local_d8,
                   &local_e8);
      }
      else {
        (local_d8._M_impl.super__Deque_impl_data._M_finish._M_cur)->z = iVar5;
        (local_d8._M_impl.super__Deque_impl_data._M_finish._M_cur)->x = local_e8.x;
        (local_d8._M_impl.super__Deque_impl_data._M_finish._M_cur)->y = local_e8.y;
        local_d8._M_impl.super__Deque_impl_data._M_finish._M_cur =
             local_d8._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
        local_e8.z = iVar5;
      }
      iVar5 = (local_d8._M_impl.super__Deque_impl_data._M_start._M_cur)->z;
    } while (iVar5 < *zoom);
  }
  pvVar3 = local_80;
  local_50._M_current._M_cur = local_d8._M_impl.super__Deque_impl_data._M_start._M_cur;
  local_50._M_current._M_first = local_d8._M_impl.super__Deque_impl_data._M_start._M_first;
  local_50._M_current._M_last = local_d8._M_impl.super__Deque_impl_data._M_start._M_last;
  local_50._M_current._M_node = local_d8._M_impl.super__Deque_impl_data._M_start._M_node;
  local_78._M_current._M_cur = local_d8._M_impl.super__Deque_impl_data._M_finish._M_cur;
  local_78._M_current._M_first = local_d8._M_impl.super__Deque_impl_data._M_finish._M_first;
  local_78._M_current._M_last = local_d8._M_impl.super__Deque_impl_data._M_finish._M_last;
  local_78._M_current._M_node = local_d8._M_impl.super__Deque_impl_data._M_finish._M_node;
  std::vector<mercatortile::Tile,std::allocator<mercatortile::Tile>>::
  vector<std::move_iterator<std::_Deque_iterator<mercatortile::Tile,mercatortile::Tile&,mercatortile::Tile*>>,void>
            (local_80,&local_50,&local_78,(allocator_type *)&local_e8);
  std::_Deque_base<mercatortile::Tile,_std::allocator<mercatortile::Tile>_>::~_Deque_base(&local_d8)
  ;
  return (vector<mercatortile::Tile,_std::allocator<mercatortile::Tile>_> *)pvVar3;
}

Assistant:

std::vector<Tile> children(const Tile &tile, const int &zoom)
{
    if (tile.z > zoom)
    {
        throw "zoom should be greater than tile zoom level.";
    };
    std::deque<Tile> return_tiles = {tile};
    while (return_tiles.front().z < zoom)
    {
        Tile front_tile = return_tiles.front();
        return_tiles.pop_front();
        return_tiles.push_back(Tile{front_tile.x * 2, front_tile.y * 2, front_tile.z + 1});
        return_tiles.push_back(Tile{front_tile.x * 2 + 1, front_tile.y * 2, front_tile.z + 1});
        return_tiles.push_back(Tile{front_tile.x * 2, front_tile.y * 2 + 1, front_tile.z + 1});
        return_tiles.push_back(Tile{front_tile.x * 2 + 1, front_tile.y * 2 + 1, front_tile.z + 1});
    }

    //TODO: hight memory, not efficiency, or consider anthoer method.
    vector<Tile> return_vector_tiles(std::make_move_iterator(return_tiles.begin()),
                                     std::make_move_iterator(return_tiles.end()));
    // copy(return_tiles.begin(), return_tiles.end(), back_inserter(return_vector_tiles));

    return return_vector_tiles;
}